

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O0

void resp0_sock_init(void *arg,nni_sock *nsock)

{
  resp0_sock *s;
  nni_sock *nsock_local;
  void *arg_local;
  
  nni_mtx_init((nni_mtx *)arg);
  nni_id_map_init((nni_id_map *)((long)arg + 0x30),0,0,false);
  nni_list_init_offset((nni_list *)((long)arg + 0x110),0x38);
  nni_list_init_offset((nni_list *)((long)arg + 0xf8),0x3c0);
  nni_atomic_init((nni_atomic_int *)((long)arg + 0x28));
  nni_atomic_set((nni_atomic_int *)((long)arg + 0x28),8);
  resp0_ctx_init((void *)((long)arg + 0x68),arg);
  nni_pollable_init((nni_pollable *)((long)arg + 0x138));
  nni_pollable_init((nni_pollable *)((long)arg + 0x128));
  return;
}

Assistant:

static void
resp0_sock_init(void *arg, nni_sock *nsock)
{
	resp0_sock *s = arg;

	NNI_ARG_UNUSED(nsock);

	nni_mtx_init(&s->mtx);
	nni_id_map_init(&s->pipes, 0, 0, false);

	NNI_LIST_INIT(&s->recvq, resp0_ctx, rqnode);
	NNI_LIST_INIT(&s->recvpipes, resp0_pipe, rnode);

	nni_atomic_init(&s->ttl);
	nni_atomic_set(&s->ttl, 8); // Per RFC

	resp0_ctx_init(&s->ctx, s);

	// We start off without being either readable or writable.
	// Readability comes when there is something on the socket.
	nni_pollable_init(&s->writable);
	nni_pollable_init(&s->readable);
}